

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

IdList * sqlite3IdListAppend(Parse *pParse,IdList *pList,Token *pToken)

{
  sqlite3 *db;
  IdList_item *pIVar1;
  char *pPtr;
  int i;
  
  db = pParse->db;
  if ((pList != (IdList *)0x0) ||
     (pList = (IdList *)sqlite3DbMallocZero(db,0x10), pList != (IdList *)0x0)) {
    pIVar1 = (IdList_item *)sqlite3ArrayAllocate(db,pList->a,0x10,&pList->nId,&i);
    pList->a = pIVar1;
    if (-1 < (long)i) {
      pPtr = sqlite3NameFromToken(db,pToken);
      pList->a[i].zName = pPtr;
      if (pPtr == (char *)0x0) {
        return pList;
      }
      if (pParse->eParseMode < 2) {
        return pList;
      }
      sqlite3RenameTokenMap(pParse,pPtr,pToken);
      return pList;
    }
    sqlite3IdListDelete(db,pList);
  }
  return (IdList *)0x0;
}

Assistant:

SQLITE_PRIVATE IdList *sqlite3IdListAppend(Parse *pParse, IdList *pList, Token *pToken){
  sqlite3 *db = pParse->db;
  int i;
  if( pList==0 ){
    pList = sqlite3DbMallocZero(db, sizeof(IdList) );
    if( pList==0 ) return 0;
  }
  pList->a = sqlite3ArrayAllocate(
      db,
      pList->a,
      sizeof(pList->a[0]),
      &pList->nId,
      &i
  );
  if( i<0 ){
    sqlite3IdListDelete(db, pList);
    return 0;
  }
  pList->a[i].zName = sqlite3NameFromToken(db, pToken);
  if( IN_RENAME_OBJECT && pList->a[i].zName ){
    sqlite3RenameTokenMap(pParse, (void*)pList->a[i].zName, pToken);
  }
  return pList;
}